

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O3

void next_token(scanner_t *s)

{
  undefined7 uVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  token_t *ptVar5;
  ulong uVar6;
  
  uVar1 = *(undefined7 *)&(s->token).field_0x11;
  (s->prev_token).token = (s->token).token;
  *(undefined7 *)&(s->prev_token).field_0x11 = uVar1;
  iVar3 = (s->token).column;
  sVar4 = (s->token).pos;
  (s->prev_token).line = (s->token).line;
  (s->prev_token).column = iVar3;
  (s->prev_token).pos = sVar4;
  if ((s->next_token).line == 0) {
    pbVar2 = (byte *)s->fmt;
    if (((s->token).token != '\0') || (*pbVar2 != 0)) {
      iVar3 = s->column + 1;
      s->column = iVar3;
      sVar4 = s->pos + 1;
      s->pos = sVar4;
      while( true ) {
        uVar6 = (ulong)*pbVar2;
        if (0x3a < uVar6) break;
        if ((0x400100100000200U >> (uVar6 & 0x3f) & 1) == 0) {
          if (uVar6 != 10) break;
          s->line = s->line + 1;
          iVar3 = 1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
        s->column = iVar3;
        sVar4 = sVar4 + 1;
        s->pos = sVar4;
        pbVar2 = pbVar2 + 1;
      }
      (s->token).token = *pbVar2;
      (s->token).line = s->line;
      (s->token).column = iVar3;
      (s->token).pos = sVar4;
      s->fmt = (char *)(pbVar2 + (*pbVar2 != 0));
      return;
    }
  }
  else {
    ptVar5 = &s->next_token;
    uVar1 = *(undefined7 *)&(s->next_token).field_0x11;
    (s->token).token = (s->next_token).token;
    *(undefined7 *)&(s->token).field_0x11 = uVar1;
    iVar3 = ptVar5->column;
    sVar4 = (s->next_token).pos;
    (s->token).line = ptVar5->line;
    (s->token).column = iVar3;
    (s->token).pos = sVar4;
    ptVar5->line = 0;
  }
  return;
}

Assistant:

static void next_token(scanner_t *s) {
    const char *t;
    s->prev_token = s->token;

    if (s->next_token.line) {
        s->token = s->next_token;
        s->next_token.line = 0;
        return;
    }

    if (!token(s) && !*s->fmt)
        return;

    t = s->fmt;
    s->column++;
    s->pos++;

    /* skip space and ignored chars */
    while (*t == ' ' || *t == '\t' || *t == '\n' || *t == ',' || *t == ':') {
        if (*t == '\n') {
            s->line++;
            s->column = 1;
        } else
            s->column++;

        s->pos++;
        t++;
    }

    s->token.token = *t;
    s->token.line = s->line;
    s->token.column = s->column;
    s->token.pos = s->pos;

    if (*t)
        t++;
    s->fmt = t;
}